

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfRelocator.cpp
# Opt level: O0

bool __thiscall
ElfRelocator::relocateFile(ElfRelocator *this,ElfRelocatorFile *file,int64_t *relocationAddress)

{
  ElfFile *this_00;
  mapped_type mVar1;
  ElfSection *pEVar2;
  long lVar3;
  Elf32_Word EVar4;
  bool bVar5;
  byte bVar6;
  Elf32_Addr EVar7;
  Elf32_Word EVar8;
  int iVar9;
  Elf32_Word EVar10;
  Endianness EVar11;
  uint uVar12;
  ErrorType type;
  ulong *puVar13;
  size_t sVar14;
  reference pEVar15;
  ByteArray *pBVar16;
  pointer pIVar17;
  size_t sVar18;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  reference pbVar22;
  byte *__dest;
  byte *__src;
  mapped_type *pmVar23;
  element_type *peVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Elf32_Sword *pEVar25;
  size_t extraout_RDX;
  string_view text;
  string_view text_00;
  undefined1 auVar26 [16];
  size_t local_340;
  long local_338;
  int64_t start_1;
  int64_t oldAddress;
  ElfRelocatorSymbol *sym_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_> *__range1_2;
  size_t local_300;
  size_t arrayStart;
  reference local_2f0;
  RelocationAction *action;
  iterator __end3;
  iterator __begin3;
  vector<RelocationAction,_std::allocator<RelocationAction>_> *__range3;
  string *error_2;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  string *error_1;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors_1;
  int local_234;
  string local_230;
  Identifier local_210;
  undefined1 local_1f0 [8];
  shared_ptr<Label> label;
  string local_1d8;
  undefined1 local_1b8 [8];
  string symName;
  long local_190;
  RelocationData relData;
  undefined1 local_160 [4];
  int symSection;
  Elf32_Sym sym;
  int symNum;
  int pos;
  Elf32_Rela rela;
  uint relOffset;
  vector<RelocationAction,_std::allocator<RelocationAction>_> relocationActions;
  int structSize;
  bool isRela;
  ElfSection *relSection;
  ByteArray sectionData;
  size_t index_1;
  ElfSection *section_1;
  ElfRelocatorSection *entry_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_> *__range1_1;
  bool error;
  size_t dataStart;
  size_t local_b0 [3];
  Elf32_Word local_94;
  size_t sStack_90;
  int size;
  size_t index;
  ElfSection *section;
  ElfRelocatorSection *entry;
  iterator __end1;
  iterator __begin1;
  vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_> *__range1;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> relocationOffsets;
  int64_t start;
  ElfFile *elf;
  int64_t *relocationAddress_local;
  ElfRelocatorFile *file_local;
  ElfRelocator *this_local;
  
  this_00 = file->elf;
  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count = *relocationAddress;
  std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::map
            ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
             &__range1);
  __end1 = std::vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>::begin
                     (&file->sections);
  entry = (ElfRelocatorSection *)
          std::vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>::end
                    (&file->sections);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<ElfRelocatorSection_*,_std::vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>_>
                                     *)&entry), bVar5) {
    section = (ElfSection *)
              __gnu_cxx::
              __normal_iterator<ElfRelocatorSection_*,_std::vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>_>
              ::operator*(&__end1);
    index = *(size_t *)&section->header;
    sStack_90 = *(size_t *)&(section->header).sh_flags;
    local_94 = ElfSection::getSize((ElfSection *)index);
    EVar8 = ElfSection::getType((ElfSection *)index);
    if (EVar8 == 8) {
      EVar7 = ElfSection::getAddress((ElfSection *)index);
      local_b0[0] = sStack_90;
      puVar13 = (ulong *)std::
                         map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                         ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                       *)&__range1,(key_type *)local_b0);
      *puVar13 = (ulong)EVar7;
    }
    else {
      while (lVar19 = *relocationAddress, EVar8 = ElfSection::getAlignment((ElfSection *)index),
            lVar19 % (long)(ulong)EVar8 != 0) {
        *relocationAddress = *relocationAddress + 1;
      }
      bVar5 = std::operator!=((shared_ptr<Label> *)&(section->header).sh_link,(nullptr_t)0x0);
      if (bVar5) {
        peVar24 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )&(section->header).sh_link);
        Label::setValue(peVar24,*relocationAddress);
      }
      mVar1 = *relocationAddress;
      dataStart = sStack_90;
      pmVar23 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                              *)&__range1,(key_type *)&dataStart);
      *pmVar23 = mVar1;
      *relocationAddress = (long)(int)local_94 + *relocationAddress;
    }
    __gnu_cxx::
    __normal_iterator<ElfRelocatorSection_*,_std::vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>_>
    ::operator++(&__end1);
  }
  sVar14 = ByteArray::size(&this->outputData);
  ByteArray::reserveBytes
            (&this->outputData,
             *relocationAddress - relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count
             ,'\0');
  __range1_1._7_1_ = 0;
  __end1_1 = std::vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>::begin
                       (&file->sections);
  entry_1 = (ElfRelocatorSection *)
            std::vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>::end
                      (&file->sections);
  do {
    bVar5 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<ElfRelocatorSection_*,_std::vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>_>
                        *)&entry_1);
    if (!bVar5) {
      __end1_2 = std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>::begin
                           (&file->symbols);
      sym_1 = (ElfRelocatorSymbol *)
              std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>::end
                        (&file->symbols);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<ElfRelocatorSymbol_*,_std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>_>
                                 *)&sym_1), bVar5) {
        oldAddress = (int64_t)__gnu_cxx::
                              __normal_iterator<ElfRelocatorSymbol_*,_std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>_>
                              ::operator*(&__end1_2);
        start_1 = ((reference)oldAddress)->relocatedAddress;
        if (((reference)oldAddress)->section == 0xfff1) {
          ((reference)oldAddress)->relocatedAddress = ((reference)oldAddress)->relativeAddress;
        }
        else if (((reference)oldAddress)->section == 0xfff2) {
          local_338 = *relocationAddress;
          while (*relocationAddress % ((reference)oldAddress)->relativeAddress != 0) {
            *relocationAddress = *relocationAddress + 1;
          }
          ((reference)oldAddress)->relocatedAddress = *relocationAddress;
          *relocationAddress = *relocationAddress + ((reference)oldAddress)->size;
          ByteArray::reserveBytes(&this->outputData,*relocationAddress - local_338,'\0');
        }
        else {
          lVar19 = ((reference)oldAddress)->relativeAddress;
          local_340 = ((reference)oldAddress)->section;
          pmVar23 = std::
                    map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                    ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                  *)&__range1,(key_type *)&local_340);
          *(long *)(oldAddress + 0x38) = lVar19 + *pmVar23;
        }
        bVar5 = std::operator!=((shared_ptr<Label> *)oldAddress,(nullptr_t)0x0);
        if (bVar5) {
          peVar24 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)oldAddress);
          Label::setValue(peVar24,*(int64_t *)(oldAddress + 0x38));
        }
        if (start_1 != *(long *)(oldAddress + 0x38)) {
          this->dataChanged = true;
        }
        __gnu_cxx::
        __normal_iterator<ElfRelocatorSymbol_*,_std::vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_>_>
        ::operator++(&__end1_2);
      }
      std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::~map
                ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
                 &__range1);
      return (bool)((__range1_1._7_1_ ^ 0xff) & 1);
    }
    pEVar15 = __gnu_cxx::
              __normal_iterator<ElfRelocatorSection_*,_std::vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>_>
              ::operator*(&__end1_1);
    pEVar2 = pEVar15->section;
    sectionData.allocatedSize_ = pEVar15->index;
    EVar8 = ElfSection::getType(pEVar2);
    if (EVar8 != 8) {
      pBVar16 = ElfSection::getData(pEVar2);
      ByteArray::ByteArray((ByteArray *)&relSection,pBVar16);
      pEVar2 = pEVar15->relSection;
      if (pEVar2 != (ElfSection *)0x0) {
        EVar8 = ElfSection::getType(pEVar2);
        iVar9 = 8;
        if (EVar8 == 4) {
          iVar9 = 0xc;
        }
        std::vector<RelocationAction,_std::allocator<RelocationAction>_>::vector
                  ((vector<RelocationAction,_std::allocator<RelocationAction>_> *)&rela.r_addend);
        rela.r_info = 0;
        while( true ) {
          EVar4 = rela.r_info;
          EVar10 = ElfSection::getSize(pEVar2);
          pcVar20 = (char *)(ulong)EVar10;
          if (EVar10 <= EVar4) break;
          pBVar16 = ElfSection::getData(pEVar2);
          EVar4 = rela.r_info;
          EVar11 = ElfFile::getEndianness(this_00);
          loadRelocation(this,(Elf32_Rela *)&symNum,EVar8 == 4,pBVar16,EVar4,EVar11);
          sym.st_info = (undefined1)symNum;
          sym.st_other = symNum._1_1_;
          sym.st_shndx = symNum._2_2_;
          pIVar17 = std::unique_ptr<IElfRelocator,_std::default_delete<IElfRelocator>_>::operator->
                              (&this->relocator);
          bVar6 = Elf32_Rela::getType((Elf32_Rela *)&symNum);
          uVar12 = (*pIVar17->_vptr_IElfRelocator[3])(pIVar17,(ulong)bVar6);
          if ((uVar12 & 1) == 0) {
            sym.st_size = Elf32_Rela::getSymbolNum((Elf32_Rela *)&symNum);
            if ((int)sym.st_size < 1) {
              Logger::queueError<int>((Logger *)0x0,0x2297a6,(char *)&sym.st_size,(int *)pBVar16);
              __range1_1._7_1_ = 1;
            }
            else {
              ElfFile::getSymbol(this_00,(Elf32_Sym *)local_160,(long)(int)sym.st_size);
              relData.targetSymbolInfo = (int)sym.st_value._2_2_;
              sVar18 = (size_t)(int)sym._12_4_;
              EVar11 = ElfFile::getEndianness(this_00);
              relData.relocationBase._0_4_ =
                   ByteArray::getDoubleWord((ByteArray *)&relSection,sVar18,EVar11);
              lVar19 = (long)(int)sym._12_4_;
              symName.field_2._8_8_ = sectionData.allocatedSize_;
              pmVar23 = std::
                        map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                        ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                      *)&__range1,(key_type *)(symName.field_2._M_local_buf + 8));
              local_190 = lVar19 + *pmVar23;
              relData.relocationBase._4_4_ = rela.r_offset;
              pIVar17 = std::unique_ptr<IElfRelocator,_std::default_delete<IElfRelocator>_>::
                        operator->(&this->relocator);
              (*pIVar17->_vptr_IElfRelocator[6])
                        (pIVar17,&local_190,(ulong)(uint)symSection,
                         (ulong)((byte)sym.st_value & 0xf));
              if (sym.st_value._2_2_ == 0) {
                if (local_160 == (undefined1  [4])0x0) {
                  Logger::queueError<>(Error,"Symbol without a name");
                  __range1_1._7_1_ = 1;
                }
                else {
                  pcVar20 = ElfFile::getStrTableString(this_00,(ulong)(uint)local_160);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1d8,pcVar20,
                             (allocator<char> *)
                             ((long)&label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 7));
                  toLowercase((string *)local_1b8,&local_1d8);
                  std::__cxx11::string::~string((string *)&local_1d8);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 7));
                  std::__cxx11::string::string((string *)&local_230,(string *)local_1b8);
                  Identifier::Identifier(&local_210,&local_230);
                  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0xffffffff;
                  SymbolTable::getLabel
                            ((SymbolTable *)local_1f0,(Identifier *)&Global.symbolTable,
                             (int)&local_210,-1);
                  Identifier::~Identifier(&local_210);
                  std::__cxx11::string::~string((string *)&local_230);
                  bVar5 = std::operator==((shared_ptr<Label> *)local_1f0,(nullptr_t)0x0);
                  if (bVar5) {
                    Logger::queueError<std::__cxx11::string>((Logger *)0x1,0x2297d4,local_1b8,args);
                    __range1_1._7_1_ = 1;
                    local_234 = 10;
                  }
                  else {
                    peVar24 = std::
                              __shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                              operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_1f0);
                    bVar5 = Label::isDefined(peVar24);
                    if (bVar5) {
                      peVar24 = std::
                                __shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_1f0);
                      uVar21 = Label::getValue(peVar24);
                      relData.opcodeOffset = uVar21 & 0xffffffff;
                      peVar24 = std::
                                __shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_1f0);
                      bVar5 = Label::isData(peVar24);
                      relData.symbolAddress._0_4_ = 2 - (uint)bVar5;
                      peVar24 = std::
                                __shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_1f0);
                      relData.symbolAddress._4_4_ = Label::getInfo(peVar24);
                      local_234 = 0;
                    }
                    else {
                      Logger::queueError<std::__cxx11::string,std::__cxx11::string>
                                (Error,"Undefined external symbol %s in file %s",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1b8,&file->name);
                      __range1_1._7_1_ = 1;
                      local_234 = 10;
                    }
                  }
                  std::shared_ptr<Label>::~shared_ptr((shared_ptr<Label> *)local_1f0);
                  std::__cxx11::string::~string((string *)local_1b8);
                  if (local_234 == 0) goto LAB_001ed093;
                }
              }
              else {
                errors_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(long)relData.targetSymbolInfo;
                pmVar23 = std::
                          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                          ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                        *)&__range1,
                                       (key_type *)
                                       &errors_1.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                relData.opcodeOffset = *pmVar23 + relData._16_8_;
LAB_001ed093:
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range5);
                pIVar17 = std::unique_ptr<IElfRelocator,_std::default_delete<IElfRelocator>_>::
                          operator->(&this->relocator);
                bVar6 = Elf32_Rela::getType((Elf32_Rela *)&symNum);
                pEVar25 = &rela.r_addend;
                uVar12 = (*pIVar17->_vptr_IElfRelocator[4])
                                   (pIVar17,(ulong)bVar6,&local_190,pEVar25,&__range5);
                if ((uVar12 & 1) == 0) {
                  __end5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&__range5);
                  error_1 = (string *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&__range5);
                  while (bVar5 = __gnu_cxx::operator!=
                                           (&__end5,(
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)&error_1), bVar5) {
                    pbVar22 = __gnu_cxx::
                              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*(&__end5);
                    auVar26 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)pbVar22);
                    text._M_len = auVar26._8_8_;
                    errors.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar26._0_8_;
                    text._M_str = (char *)pEVar25;
                    Logger::queueError((Logger *)0x1,auVar26._0_4_,text);
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++(&__end5);
                  }
                  __range1_1._7_1_ = 1;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range5);
              }
            }
          }
          rela.r_info = iVar9 + rela.r_info;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range4);
        pIVar17 = std::unique_ptr<IElfRelocator,_std::default_delete<IElfRelocator>_>::operator->
                            (&this->relocator);
        uVar12 = (*pIVar17->_vptr_IElfRelocator[5])
                           (pIVar17,&rela.r_addend,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__range4);
        if ((uVar12 & 1) == 0) {
          __end4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range4);
          error_2 = (string *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range4);
          while (bVar5 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&error_2), bVar5) {
            pbVar22 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end4);
            type = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar22);
            text_00._M_str = pcVar20;
            text_00._M_len = extraout_RDX;
            Logger::queueError((Logger *)0x1,type,text_00);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end4);
          }
          __range1_1._7_1_ = 1;
        }
        __end3 = std::vector<RelocationAction,_std::allocator<RelocationAction>_>::begin
                           ((vector<RelocationAction,_std::allocator<RelocationAction>_> *)
                            &rela.r_addend);
        action = (RelocationAction *)
                 std::vector<RelocationAction,_std::allocator<RelocationAction>_>::end
                           ((vector<RelocationAction,_std::allocator<RelocationAction>_> *)
                            &rela.r_addend);
        while (bVar5 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<RelocationAction_*,_std::vector<RelocationAction,_std::allocator<RelocationAction>_>_>
                                           *)&action), bVar5) {
          local_2f0 = __gnu_cxx::
                      __normal_iterator<RelocationAction_*,_std::vector<RelocationAction,_std::allocator<RelocationAction>_>_>
                      ::operator*(&__end3);
          lVar19 = local_2f0->offset;
          arrayStart = sectionData.allocatedSize_;
          pmVar23 = std::
                    map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                    ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                                  *)&__range1,(key_type *)&arrayStart);
          lVar3 = *pmVar23;
          uVar12 = local_2f0->newValue;
          EVar11 = ElfFile::getEndianness(this_00);
          ByteArray::replaceDoubleWord((ByteArray *)&relSection,lVar19 - lVar3,uVar12,EVar11);
          __gnu_cxx::
          __normal_iterator<RelocationAction_*,_std::vector<RelocationAction,_std::allocator<RelocationAction>_>_>
          ::operator++(&__end3);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range4);
        std::vector<RelocationAction,_std::allocator<RelocationAction>_>::~vector
                  ((vector<RelocationAction,_std::allocator<RelocationAction>_> *)&rela.r_addend);
      }
      __range1_2 = (vector<ElfRelocatorSymbol,_std::allocator<ElfRelocatorSymbol>_> *)
                   sectionData.allocatedSize_;
      pmVar23 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                              *)&__range1,(key_type *)&__range1_2);
      local_300 = (sVar14 + *pmVar23) -
                  relocationOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __dest = ByteArray::data(&this->outputData,local_300);
      __src = ByteArray::data((ByteArray *)&relSection,0);
      sVar18 = ByteArray::size((ByteArray *)&relSection);
      memcpy(__dest,__src,sVar18);
      ByteArray::~ByteArray((ByteArray *)&relSection);
    }
    __gnu_cxx::
    __normal_iterator<ElfRelocatorSection_*,_std::vector<ElfRelocatorSection,_std::allocator<ElfRelocatorSection>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

bool ElfRelocator::relocateFile(ElfRelocatorFile& file, int64_t& relocationAddress)
{
	ElfFile* elf = file.elf;
	int64_t start = relocationAddress;

	// calculate address for each section
	std::map<int64_t,int64_t> relocationOffsets;
	for (ElfRelocatorSection& entry: file.sections)
	{
		ElfSection* section = entry.section;
		size_t index = entry.index;
		int size = section->getSize();

		if (section->getType() == SHT_NOBITS) 
		{
			// these sections should not be relocated...
			relocationOffsets[index] = section->getAddress();

		} else {
			while (relocationAddress % section->getAlignment())
				relocationAddress++;

			if (entry.label != nullptr)
				entry.label->setValue(relocationAddress);

			relocationOffsets[index] = relocationAddress;
			relocationAddress += size;
		}
	}

	size_t dataStart = outputData.size();
	outputData.reserveBytes((size_t)(relocationAddress-start));

	// load sections
	bool error = false;
	for (ElfRelocatorSection& entry: file.sections)
	{
		ElfSection* section = entry.section;
		size_t index = entry.index;

		if (section->getType() == SHT_NOBITS)
		{
			// reserveBytes initialized the data to 0 already
			continue;
		}
		
		ByteArray sectionData = section->getData();

		// relocate if necessary
		ElfSection* relSection = entry.relSection;
		if (relSection != nullptr)
		{
			bool isRela = relSection->getType() == SHT_RELA;
			int structSize = isRela ? sizeof(Elf32_Rela) : sizeof(Elf32_Rel);

			std::vector<RelocationAction> relocationActions;
			for (unsigned int relOffset = 0; relOffset < relSection->getSize(); relOffset += structSize)
			{
				Elf32_Rela rela;
				loadRelocation(rela, isRela, relSection->getData(), relOffset, elf->getEndianness());
				int pos = rela.r_offset;

				if (relocator->isDummyRelocationType(rela.getType()))
					continue;

				int symNum = rela.getSymbolNum();
				if (symNum <= 0)
				{
					Logger::queueError(Logger::Warning, "Invalid symbol num %06X",symNum);
					error = true;
					continue;
				}

				Elf32_Sym sym;
				elf->getSymbol(sym, symNum);
				int symSection = sym.st_shndx;
				
				RelocationData relData;
				relData.opcode = sectionData.getDoubleWord(pos, elf->getEndianness());
				relData.opcodeOffset = pos+relocationOffsets[index];
				relData.addend = rela.r_addend;
				relocator->setSymbolAddress(relData,sym.st_value,sym.st_info & 0xF);

				// externs?
				if (sym.st_shndx == 0)
				{
					if (sym.st_name == 0)
					{
						Logger::queueError(Logger::Error, "Symbol without a name");
						error = true;
						continue;
					}

					std::string symName = toLowercase(elf->getStrTableString(sym.st_name));

					std::shared_ptr<Label> label = Global.symbolTable.getLabel(Identifier(symName),-1,-1);
					if (label == nullptr)
					{
						Logger::queueError(Logger::Error, "Invalid external symbol %s",symName);
						error = true;
						continue;
					}
					if (!label->isDefined())
					{
						Logger::queueError(Logger::Error, "Undefined external symbol %s in file %s",symName,file.name);
						error = true;
						continue;
					}
					
					relData.relocationBase = (unsigned int) label->getValue();
					relData.targetSymbolType = label->isData() ? STT_OBJECT : STT_FUNC;
					relData.targetSymbolInfo = label->getInfo();
				} else {
					relData.relocationBase = relocationOffsets[symSection]+relData.symbolAddress;
				}

				std::vector<std::string> errors;
				if (!relocator->relocateOpcode(rela.getType(), relData, relocationActions, errors))
				{
					for (const std::string& error : errors)
					{
						Logger::queueError(Logger::Error, error);
					}
					error = true;
					continue;
				}
			}

			// finish any dangling relocations
			std::vector<std::string> errors;
			if (!relocator->finish(relocationActions, errors))
			{
				for (const std::string& error : errors)
				{
					Logger::queueError(Logger::Error, error);
				}
				error = true;
			}

			// now actually write the relocated values
			for (const RelocationAction& action : relocationActions)
			{
				sectionData.replaceDoubleWord(action.offset-relocationOffsets[index], action.newValue, elf->getEndianness());
			}
		}

		size_t arrayStart = (size_t) (dataStart+relocationOffsets[index]-start);
		memcpy(outputData.data(arrayStart),sectionData.data(),sectionData.size());
	}
	
	// now update symbols
	for (ElfRelocatorSymbol& sym: file.symbols)
	{
		int64_t oldAddress = sym.relocatedAddress;

		switch (sym.section)
		{
		case SHN_ABS:		// address does not change
			sym.relocatedAddress = sym.relativeAddress;
			break;
		case SHN_COMMON:	// needs to be allocated. relativeAddress gives alignment constraint
			{
				int64_t start = relocationAddress;

				while (relocationAddress % sym.relativeAddress)
					relocationAddress++;

				sym.relocatedAddress = relocationAddress;
				relocationAddress += sym.size;
				outputData.reserveBytes((size_t)(relocationAddress-start));
			}
			break;
		default:			// normal relocated symbol
			sym.relocatedAddress = sym.relativeAddress+relocationOffsets[sym.section];
			break;
		}

		if (sym.label != nullptr)
			sym.label->setValue(sym.relocatedAddress);

		if (oldAddress != sym.relocatedAddress)
			dataChanged = true;
	}

	return !error;
}